

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

Result emulator_write_state_to_file(Emulator *e,char *filename)

{
  Result RVar1;
  FileData file_data;
  FileData local_30;
  
  local_30.size = 0x30bc0;
  local_30.data = (u8 *)malloc(0x30bc0);
  (e->state).header = 0x6b57a7e2;
  memcpy(local_30.data,&e->state,0x30bc0);
  RVar1 = file_write(filename,&local_30);
  file_data_delete(&local_30);
  return (Result)(RVar1 != OK);
}

Assistant:

Result emulator_write_state_to_file(Emulator* e, const char* filename) {
  Result result = ERROR;
  FileData file_data;
  emulator_init_state_file_data(&file_data);
  CHECK(SUCCESS(emulator_write_state(e, &file_data)));
  CHECK(SUCCESS(file_write(filename, &file_data)));
  result = OK;
error:
  file_data_delete(&file_data);
  return result;
}